

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

void __thiscall
cimg_library::CImg<unsigned_short>::CImg
          (CImg<unsigned_short> *this,uint size_x,uint size_y,uint size_z,uint size_c)

{
  uint uVar1;
  unsigned_short *puVar2;
  
  this->_is_shared = false;
  uVar1 = size_z * size_c * size_y * size_x;
  if (uVar1 == 0) {
    this->_data = (unsigned_short *)0x0;
    this->_width = 0;
    this->_height = 0;
    this->_depth = 0;
    this->_spectrum = 0;
  }
  else {
    this->_width = size_x;
    this->_height = size_y;
    this->_depth = size_z;
    this->_spectrum = size_c;
    puVar2 = (unsigned_short *)operator_new__((ulong)uVar1 * 2);
    this->_data = puVar2;
  }
  return;
}

Assistant:

explicit CImg(const unsigned int size_x, const unsigned int size_y=1, const unsigned int size_z=1, const unsigned int size_c=1):
      _is_shared(false) {
      const unsigned int siz = size_x*size_y*size_z*size_c;
      if (siz) {
        _width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c;
        try { _data = new T[siz]; } catch (...) {
          _width = _height = _depth = _spectrum = 0; _data = 0;
          throw CImgInstanceException(_cimg_instance
                                      "CImg() : Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      cimg::strbuffersize(size_x*size_y*size_z*size_c*sizeof(T)),size_x,size_y,size_z,size_c);
        }
      } else { _width = _height = _depth = _spectrum = 0; _data = 0; }
    }